

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

int SSE_16xN_SSE2(uint8_t *a,uint8_t *b,int num_pairs)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  ulong uVar21;
  int iVar22;
  int iVar24;
  int iVar26;
  int iVar27;
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong uVar23;
  
  uVar21 = 0;
  uVar23 = (ulong)(uint)num_pairs;
  if (num_pairs < 1) {
    uVar23 = uVar21;
  }
  iVar24 = 0;
  iVar26 = 0;
  iVar27 = 0;
  iVar28 = 0;
  while (iVar22 = (int)uVar23, uVar23 = (ulong)(iVar22 - 1), iVar22 != 0) {
    auVar32 = psubusb(*(undefined1 (*) [16])(a + uVar21),*(undefined1 (*) [16])(b + uVar21));
    auVar30 = psubusb(*(undefined1 (*) [16])(b + uVar21),*(undefined1 (*) [16])(a + uVar21));
    auVar30 = auVar30 | auVar32;
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar30._0_13_;
    auVar1[0xe] = auVar30[7];
    auVar3[0xc] = auVar30[6];
    auVar3._0_12_ = auVar30._0_12_;
    auVar3._13_2_ = auVar1._13_2_;
    auVar5[0xb] = 0;
    auVar5._0_11_ = auVar30._0_11_;
    auVar5._12_3_ = auVar3._12_3_;
    auVar7[10] = auVar30[5];
    auVar7._0_10_ = auVar30._0_10_;
    auVar7._11_4_ = auVar5._11_4_;
    auVar9[9] = 0;
    auVar9._0_9_ = auVar30._0_9_;
    auVar9._10_5_ = auVar7._10_5_;
    auVar11[8] = auVar30[4];
    auVar11._0_8_ = auVar30._0_8_;
    auVar11._9_6_ = auVar9._9_6_;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = auVar11._8_7_;
    auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
    auVar17[0] = auVar30[3];
    auVar17._9_6_ = 0;
    auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
    auVar18[0] = auVar30[2];
    auVar18._11_4_ = 0;
    auVar13[2] = auVar30[1];
    auVar13._0_2_ = auVar30._0_2_;
    auVar13._3_12_ = SUB1512(auVar18 << 0x20,3);
    auVar32._0_2_ = auVar30._0_2_ & 0xff;
    auVar32._2_13_ = auVar13._2_13_;
    auVar32[0xf] = 0;
    auVar31[1] = 0;
    auVar31[0] = auVar30[8];
    auVar31[2] = auVar30[9];
    auVar31[3] = 0;
    auVar31[4] = auVar30[10];
    auVar31[5] = 0;
    auVar31[6] = auVar30[0xb];
    auVar31[7] = 0;
    auVar31[8] = auVar30[0xc];
    auVar31[9] = 0;
    auVar31[10] = auVar30[0xd];
    auVar31[0xb] = 0;
    auVar31[0xc] = auVar30[0xe];
    auVar31[0xd] = 0;
    auVar31[0xe] = auVar30[0xf];
    auVar31[0xf] = 0;
    auVar25 = pmaddwd(auVar32,auVar32);
    auVar31 = pmaddwd(auVar31,auVar31);
    auVar30 = psubusb(*(undefined1 (*) [16])(a + uVar21 + 0x20),
                      *(undefined1 (*) [16])(b + uVar21 + 0x20));
    auVar32 = psubusb(*(undefined1 (*) [16])(b + uVar21 + 0x20),
                      *(undefined1 (*) [16])(a + uVar21 + 0x20));
    auVar32 = auVar32 | auVar30;
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar32._0_13_;
    auVar2[0xe] = auVar32[7];
    auVar4[0xc] = auVar32[6];
    auVar4._0_12_ = auVar32._0_12_;
    auVar4._13_2_ = auVar2._13_2_;
    auVar6[0xb] = 0;
    auVar6._0_11_ = auVar32._0_11_;
    auVar6._12_3_ = auVar4._12_3_;
    auVar8[10] = auVar32[5];
    auVar8._0_10_ = auVar32._0_10_;
    auVar8._11_4_ = auVar6._11_4_;
    auVar10[9] = 0;
    auVar10._0_9_ = auVar32._0_9_;
    auVar10._10_5_ = auVar8._10_5_;
    auVar12[8] = auVar32[4];
    auVar12._0_8_ = auVar32._0_8_;
    auVar12._9_6_ = auVar10._9_6_;
    auVar16._7_8_ = 0;
    auVar16._0_7_ = auVar12._8_7_;
    auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
    auVar19[0] = auVar32[3];
    auVar19._9_6_ = 0;
    auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
    auVar20[0] = auVar32[2];
    auVar20._11_4_ = 0;
    auVar14[2] = auVar32[1];
    auVar14._0_2_ = auVar32._0_2_;
    auVar14._3_12_ = SUB1512(auVar20 << 0x20,3);
    auVar29._0_2_ = auVar32._0_2_ & 0xff;
    auVar29._2_13_ = auVar14._2_13_;
    auVar29[0xf] = 0;
    auVar30[1] = 0;
    auVar30[0] = auVar32[8];
    auVar30[2] = auVar32[9];
    auVar30[3] = 0;
    auVar30[4] = auVar32[10];
    auVar30[5] = 0;
    auVar30[6] = auVar32[0xb];
    auVar30[7] = 0;
    auVar30[8] = auVar32[0xc];
    auVar30[9] = 0;
    auVar30[10] = auVar32[0xd];
    auVar30[0xb] = 0;
    auVar30[0xc] = auVar32[0xe];
    auVar30[0xd] = 0;
    auVar30[0xe] = auVar32[0xf];
    auVar30[0xf] = 0;
    auVar29 = pmaddwd(auVar29,auVar29);
    auVar32 = pmaddwd(auVar30,auVar30);
    iVar24 = auVar25._0_4_ + iVar24 + auVar29._0_4_ + auVar31._0_4_ + auVar32._0_4_;
    iVar26 = auVar25._4_4_ + iVar26 + auVar29._4_4_ + auVar31._4_4_ + auVar32._4_4_;
    iVar27 = auVar25._8_4_ + iVar27 + auVar29._8_4_ + auVar31._8_4_ + auVar32._8_4_;
    iVar28 = auVar25._12_4_ + iVar28 + auVar29._12_4_ + auVar31._12_4_ + auVar32._12_4_;
    uVar21 = uVar21 + 0x40;
  }
  return iVar28 + iVar26 + iVar27 + iVar24;
}

Assistant:

static WEBP_INLINE int SSE_16xN_SSE2(const uint8_t* a, const uint8_t* b,
                                     int num_pairs) {
  __m128i sum = _mm_setzero_si128();
  int32_t tmp[4];
  int i;

  for (i = 0; i < num_pairs; ++i) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[BPS * 0]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&b[BPS * 0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[BPS * 1]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&b[BPS * 1]);
    __m128i sum1, sum2;
    SubtractAndAccumulate_SSE2(a0, b0, &sum1);
    SubtractAndAccumulate_SSE2(a1, b1, &sum2);
    sum = _mm_add_epi32(sum, _mm_add_epi32(sum1, sum2));
    a += 2 * BPS;
    b += 2 * BPS;
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  return (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
}